

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  char *buffer;
  byte bVar1;
  ParseInfoTree *this_00;
  Finder *pFVar2;
  bool bVar3;
  int iVar4;
  ParseInfoTree *pPVar5;
  undefined4 extraout_var;
  Nonnull<char_*> pcVar6;
  Message *pMVar7;
  Nonnull<const_char_*> failure_msg;
  AlphaNum *in_R8;
  string_view message_00;
  string delimiter;
  string local_e0;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  MessageFactory *factory;
  
  iVar4 = this->recursion_limit_;
  this->recursion_limit_ = iVar4 + -1;
  if (iVar4 < 1) {
    local_e0._M_dataplus._M_p = (pointer)0x4b;
    local_e0._M_string_length = 0x450ac7;
    buffer = local_90.digits_;
    pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (this->initial_recursion_limit_,buffer);
    local_90.piece_._M_len = (long)pcVar6 - (long)buffer;
    local_60.piece_._M_len = 1;
    local_60.piece_._M_str = ".";
    local_90.piece_._M_str = buffer;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b0,(lts_20250127 *)&local_e0,&local_90,&local_60,in_R8);
    message_00._M_str = local_b0._M_dataplus._M_p;
    message_00._M_len = local_b0._M_string_length;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message_00)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  this_00 = this->parse_info_tree_;
  if (this_00 != (ParseInfoTree *)0x0) {
    pPVar5 = ParseInfoTree::CreateNested(this_00,field);
    this->parse_info_tree_ = pPVar5;
  }
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  bVar3 = ConsumeMessageDelimiter(this,&local_e0);
  if (bVar3) {
    pFVar2 = this->finder_;
    if (pFVar2 == (Finder *)0x0) {
      factory = (MessageFactory *)0x0;
    }
    else {
      iVar4 = (*pFVar2->_vptr_Finder[5])(pFVar2,field);
      factory = (MessageFactory *)CONCAT44(extraout_var,iVar4);
    }
    bVar1 = field->field_0x1;
    bVar3 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 != bVar3) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar3,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    if ((bVar1 & 0x20) == 0) {
      pMVar7 = Reflection::MutableMessage(reflection,message,field,factory);
      bVar3 = ConsumeMessage(this,pMVar7,&local_e0);
    }
    else {
      pMVar7 = Reflection::AddMessage(reflection,message,field,factory);
      bVar3 = ConsumeMessage(this,pMVar7,&local_e0);
    }
    if (bVar3 != false) {
      this->recursion_limit_ = this->recursion_limit_ + 1;
      this->parse_info_tree_ = this_00;
      bVar3 = true;
      goto LAB_002b38c8;
    }
  }
  bVar3 = false;
LAB_002b38c8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool ConsumeFieldMessage(Message* message, const Reflection* reflection,
                           const FieldDescriptor* field) {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }
    // If the parse information tree is not nullptr, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != nullptr) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    MessageFactory* factory =
        finder_ ? finder_->FindExtensionFactory(field) : nullptr;
    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field, factory),
                        delimiter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field, factory),
                        delimiter));
    }

    ++recursion_limit_;

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }